

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_stack.c
# Opt level: O0

void adt_stack_resize(adt_stack_t *self,uint32_t u32Len)

{
  uint local_24;
  void **ppvStack_20;
  uint32_t u32i;
  void **ppAlloc;
  uint32_t u32Len_local;
  adt_stack_t *self_local;
  
  ppvStack_20 = (void **)0x0;
  if ((self != (adt_stack_t *)0x0) && (u32Len != self->u32AllocLen)) {
    if (self->u32AllocLen < self->u32CurLen) {
      __assert_fail("self->u32AllocLen>=self->u32CurLen",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_stack.c"
                    ,0x7c,"void adt_stack_resize(adt_stack_t *, uint32_t)");
    }
    if ((u32Len != 0) &&
       (ppvStack_20 = (void **)malloc((ulong)u32Len << 3), ppvStack_20 == (void **)0x0)) {
      __assert_fail("ppAlloc != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_stack.c"
                    ,0x7f,"void adt_stack_resize(adt_stack_t *, uint32_t)");
    }
    if (self->ppAlloc != (void **)0x0) {
      if (self->u32AllocLen < u32Len) {
        memcpy(ppvStack_20,self->ppAlloc,(ulong)self->u32AllocLen << 3);
      }
      else {
        if ((u32Len < self->u32CurLen) &&
           (local_24 = u32Len, self->pDestructor != (_func_void_void_ptr *)0x0)) {
          for (; local_24 < self->u32CurLen; local_24 = local_24 + 1) {
            (*self->pDestructor)(self->ppAlloc[local_24]);
          }
        }
        memcpy(ppvStack_20,self->ppAlloc,(ulong)u32Len << 3);
      }
      free(self->ppAlloc);
    }
    self->ppAlloc = ppvStack_20;
    self->u32AllocLen = u32Len;
  }
  return;
}

Assistant:

void adt_stack_resize(adt_stack_t *self,uint32_t u32Len){
	void **ppAlloc = (void**) 0;
	if(!self) return;
	if(u32Len == self->u32AllocLen) return; //nothing to do

	assert(self->u32AllocLen>=self->u32CurLen);
	if(u32Len>0){
		ppAlloc = (void**) malloc(u32Len * sizeof(void*));
		assert(ppAlloc != 0);
	}
	if(self->ppAlloc){
		if(u32Len > self->u32AllocLen){
			//grow
			memcpy(ppAlloc,self->ppAlloc,self->u32AllocLen * sizeof(void*));
		}
		else{
			//shrink
			if( self->u32CurLen > u32Len){
				//call destructor on superfluous elements
				if(self->pDestructor){
					uint32_t u32i;
					for(u32i=u32Len; u32i < self->u32CurLen;u32i++){
						self->pDestructor(self->ppAlloc[u32i]);
					}
				}
			}
			memcpy(ppAlloc,self->ppAlloc,u32Len * sizeof(void*));
		}
		free(self->ppAlloc);
	}
	self->ppAlloc = ppAlloc;
	self->u32AllocLen = u32Len;

}